

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  undefined4 *in_RCX;
  long in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Option opt_g_1;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  size_t elemsize;
  int channels;
  int h;
  int w;
  conv_int8_func conv_int8;
  conv_func conv;
  conv_int8_func conv_int8_func_table [5] [5];
  conv_func conv_func_table [5] [5];
  int stride;
  int kernel_size;
  Option *in_stack_00000730;
  Mat *in_stack_00000738;
  Mat *in_stack_00000740;
  Convolution *in_stack_00000748;
  Mat *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd04;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  Mat local_2c0;
  undefined4 local_288;
  undefined4 uStack_284;
  Allocator *pAStack_280;
  undefined8 local_278;
  uint local_270;
  Mat local_260;
  Mat local_228;
  size_t local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  code *local_1d8;
  code *local_1d0;
  long local_1c8 [26];
  long local_f8 [25];
  int local_30;
  int local_2c;
  undefined4 *local_28;
  long local_20;
  Mat *local_18;
  int local_4;
  
  if (in_RSI->dims != 3) {
    iVar2 = Convolution::forward
                      (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
    return iVar2;
  }
  if ((*(int *)((long)&in_RDI[2].elemsize + 4) != *(int *)&in_RDI[2].allocator) ||
     (in_RDI[2].w != in_RDI[2].h)) {
    iVar2 = Convolution::forward
                      (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
    return iVar2;
  }
  local_2c = *(int *)((long)&in_RDI[2].elemsize + 4);
  local_30 = in_RDI[2].w;
  if (((5 < local_2c) || (5 < local_30)) ||
     (*(int *)((long)&in_RDI[2].allocator + 4) != in_RDI[2].dims)) {
    iVar2 = Convolution::forward
                      (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
    return iVar2;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memcpy(local_f8,&PTR_conv1x1s1_sse_00176670,200);
  memcpy(local_1c8,&PTR_conv1x1s1_int8_sse_00176740,200);
  local_1d0 = (code *)0x0;
  local_1d8 = (code *)0x0;
  if ((in_RDI[5].elemsize & 1) == 0) {
    local_1d0 = (code *)local_f8[(long)(local_2c + -1) * 5 + (long)(local_30 + -1)];
    if (local_1d0 == (code *)0x0) {
      iVar2 = Convolution::forward
                        (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
      return iVar2;
    }
    if (*(int *)((long)&in_RDI[2].allocator + 4) != 1) {
      if (local_30 != 1) {
        iVar2 = Convolution::forward
                          (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
        return iVar2;
      }
      iVar2 = (**(code **)((long)in_RDI->data + 0x40))(in_RDI,local_18,local_20,local_1d0,local_28);
      return iVar2;
    }
  }
  else {
    local_1d8 = (code *)local_1c8[(long)(local_2c + -1) * 5 + (long)(local_30 + -1)];
    if (local_1d8 == (code *)0x0) {
      iVar2 = Convolution::forward
                        (in_stack_00000748,in_stack_00000740,in_stack_00000738,in_stack_00000730);
      return iVar2;
    }
  }
  local_1dc = local_18->w;
  local_1e0 = local_18->h;
  local_1e4 = local_18->c;
  local_1f0 = local_18->elemsize;
  Mat::Mat(&local_228,local_18);
  if (((in_RDI[5].elemsize & 1) != 0) && (local_1f0 != 1)) {
    Mat::Mat(&local_260);
    Mat::create(in_RDI,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04
                ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                (Allocator *)in_stack_fffffffffffffcf0);
    bVar1 = Mat::empty(in_stack_fffffffffffffcf0);
    in_stack_fffffffffffffd0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd0c);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_278 = *(undefined8 *)(local_28 + 4);
      local_288 = *local_28;
      uStack_284 = local_28[1];
      pAStack_280 = local_260.allocator;
      (**(code **)(*(long *)in_RDI[5].allocator + 0x28))
                (in_RDI[5].allocator,local_18,&local_260,&local_288);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                     in_stack_fffffffffffffcf0);
    }
    local_270 = (uint)bVar1;
    Mat::~Mat((Mat *)0x113879);
    if (local_270 != 0) goto LAB_00113c8b;
  }
  Mat::Mat(&local_2c0,&local_228);
  if ((in_RDI[2].c < 1) && ((int)in_RDI[2].cstep < 1)) {
    if ((in_RDI[2].c == -0xe9) && ((int)in_RDI[2].cstep == -0xe9)) {
      local_2c4 = (local_2c + ((local_1dc + -1) / local_30) * local_30) - local_1dc;
      local_2c8 = (local_2c + ((local_1e0 + -1) / local_30) * local_30) - local_1e0;
      in_stack_fffffffffffffd04 = local_2c;
      in_stack_fffffffffffffd08 = local_2c;
      if ((0 < local_2c4) || (0 < local_2c8)) {
        in_stack_fffffffffffffcf0 = *(Mat **)(local_28 + 4);
        in_stack_fffffffffffffcf8 = local_28[1];
        copy_make_border((Mat *)conv_func_table[1][3],(Mat *)conv_func_table[1][2],
                         conv_func_table[1][1]._4_4_,(int)conv_func_table[1][1],
                         conv_func_table[1][0]._4_4_,(int)conv_func_table[1][0],
                         (int)conv_func_table[2][0],conv_func_table[0][4]._4_4_,
                         (Allocator *)conv_func_table[2][1],(int)conv_func_table[2][2]);
        bVar1 = Mat::empty(in_stack_fffffffffffffcf0);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00113c81;
        }
      }
      local_1dc = local_2c0.w;
      local_1e0 = local_2c0.h;
    }
LAB_00113adf:
    local_2cc = (local_1dc - local_2c) / local_30 + 1;
    local_2d0 = (local_1e0 - local_2c) / local_30 + 1;
    Mat::create(in_RDI,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04
                ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                (Allocator *)in_stack_fffffffffffffcf0);
    bVar1 = Mat::empty(in_stack_fffffffffffffcf0);
    if (bVar1) {
      local_4 = -100;
    }
    else if ((in_RDI[5].elemsize & 1) == 0) {
      (*local_1d0)(&local_2c0,local_20,&in_RDI[3].refcount,&in_RDI[4].refcount,local_28);
      local_4 = 0;
    }
    else {
      (*local_1d8)(&local_2c0,local_20,&in_RDI[3].refcount,local_28);
      local_2d8 = *(undefined8 *)(local_28 + 4);
      local_2e8 = *local_28;
      uStack_2e4 = local_28[1];
      uStack_2e0 = *(undefined8 *)(local_20 + 0x18);
      (**(code **)(**(long **)&in_RDI[5].dims + 0x38))
                (*(long **)&in_RDI[5].dims,local_20,&local_2e8);
      local_4 = 0;
    }
  }
  else {
    in_stack_fffffffffffffcf0 = *(Mat **)(local_28 + 4);
    in_stack_fffffffffffffcf8 = local_28[1];
    copy_make_border((Mat *)conv_func_table[1][3],(Mat *)conv_func_table[1][2],
                     conv_func_table[1][1]._4_4_,(int)conv_func_table[1][1],
                     conv_func_table[1][0]._4_4_,(int)conv_func_table[1][0],
                     (int)conv_func_table[2][0],conv_func_table[0][4]._4_4_,
                     (Allocator *)conv_func_table[2][1],(int)conv_func_table[2][2]);
    bVar1 = Mat::empty(in_stack_fffffffffffffcf0);
    in_stack_fffffffffffffd0c =
         CONCAT13((char)((uint)in_stack_fffffffffffffd0c >> 0x18),
                  CONCAT12(bVar1,(short)in_stack_fffffffffffffd0c));
    if (!bVar1) {
      local_1dc = local_2c0.w;
      local_1e0 = local_2c0.h;
      goto LAB_00113adf;
    }
    local_4 = -100;
  }
LAB_00113c81:
  local_270 = 1;
  Mat::~Mat((Mat *)0x113c8b);
LAB_00113c8b:
  Mat::~Mat((Mat *)0x113c98);
  return local_4;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;

    if (kernel_size > 5 || stride > 5 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[5][5] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            0,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    typedef void (*conv_int8_func)(const Mat&, Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_int8_func conv_int8_func_table[5][5] =
    {
        {
            conv1x1s1_int8_sse,
            conv1x1s2_int8_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_sse,
            conv3x3s2_int8_sse,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            0,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    conv_func conv = 0;
    conv_int8_func conv_int8 = 0;

    if (use_int8_inference)
    {
        conv_int8 = conv_int8_func_table[kernel_size-1][stride-1];
        if (!conv_int8)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        conv_int8(bottom_blob_bordered, top_blob, weight_data, opt);

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

    return 0;
}